

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

tree * tree_reopen(tree *t,char *path,wchar_t restore_time)

{
  int iVar1;
  wchar_t wVar2;
  int in_EDX;
  wchar_t in_ESI;
  tree *in_RDI;
  int64_t in_stack_00000018;
  wchar_t in_stack_00000024;
  char *in_stack_00000028;
  tree *in_stack_00000030;
  
  iVar1 = 0;
  if (in_EDX != 0) {
    iVar1 = 0x80;
  }
  in_RDI->flags = iVar1;
  in_RDI->flags = in_RDI->flags | 0x100;
  in_RDI->visit_type = 0;
  in_RDI->tree_errno = 0;
  in_RDI->dirname_length = 0;
  in_RDI->depth = 0;
  in_RDI->descend = 0;
  in_RDI->current = (tree_entry *)0x0;
  in_RDI->d = (DIR *)0x0;
  in_RDI->symlink_mode = in_RDI->initial_symlink_mode;
  (in_RDI->path).length = 0;
  in_RDI->entry_fd = -1;
  in_RDI->entry_eof = 0;
  in_RDI->entry_remaining_bytes = 0;
  in_RDI->initial_filesystem_id = -1;
  tree_push(in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000018,(int64_t)t,
            (restore_time *)path);
  in_RDI->stack->flags = 4;
  in_RDI->openCount = 1;
  in_RDI->maxOpenCount = 1;
  iVar1 = open(".",0x80000);
  in_RDI->initial_dir_fd = iVar1;
  __archive_ensure_cloexec_flag(0);
  wVar2 = tree_dup(in_ESI);
  in_RDI->working_dir_fd = wVar2;
  return in_RDI;
}

Assistant:

static struct tree *
tree_reopen(struct tree *t, const char *path, int restore_time)
{
	t->flags = (restore_time)?needsRestoreTimes:0;
	t->flags |= onInitialDir;
	t->visit_type = 0;
	t->tree_errno = 0;
	t->dirname_length = 0;
	t->depth = 0;
	t->descend = 0;
	t->current = NULL;
	t->d = INVALID_DIR_HANDLE;
	t->symlink_mode = t->initial_symlink_mode;
	archive_string_empty(&t->path);
	t->entry_fd = -1;
	t->entry_eof = 0;
	t->entry_remaining_bytes = 0;
	t->initial_filesystem_id = -1;

	/* First item is set up a lot like a symlink traversal. */
	tree_push(t, path, 0, 0, 0, NULL);
	t->stack->flags = needsFirstVisit;
	t->maxOpenCount = t->openCount = 1;
	t->initial_dir_fd = open(".", O_RDONLY | O_CLOEXEC);
	__archive_ensure_cloexec_flag(t->initial_dir_fd);
	t->working_dir_fd = tree_dup(t->initial_dir_fd);
	return (t);
}